

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

QByteArray * __thiscall
QMetaEnum::valueToKeys(QByteArray *__return_storage_ptr__,QMetaEnum *this,quint64 value)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  QMetaObject *pQVar5;
  uint *puVar6;
  uint *puVar7;
  QMetaTypeInterface *pQVar8;
  void *pvVar9;
  bool bVar10;
  Data *pDVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  quint64 qVar17;
  long in_FS_OFFSET;
  QByteArrayView local_260;
  QVLABase<QByteArrayView> local_250;
  undefined1 local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar5 = this->mobj;
  if (pQVar5 == (QMetaObject *)0x0) goto LAB_00283b82;
  puVar6 = (this->data).d;
  uVar2 = puVar6[2];
  if ((uVar2 & 0x40) == 0) {
    if ((uVar2 & 1) == 0) {
      puVar7 = (pQVar5->d).data;
      pQVar8 = (pQVar5->d).metaTypes
               [(long)(int)puVar7[6] +
                (ulong)((int)((ulong)((long)puVar6 - (long)puVar7) >> 2) - puVar7[9]) / 5];
      if ((pQVar8 == (QMetaTypeInterface *)0x0) || ((pQVar8->flags & 0x100) == 0)) {
        if ((long)(int)value != value) goto LAB_00283b82;
        goto LAB_00283976;
      }
    }
    bVar10 = true;
    if (value >> 0x20 != 0) goto LAB_00283b82;
  }
  else {
LAB_00283976:
    bVar10 = false;
  }
  memset(local_238,0xaa,0x200);
  local_250.super_QVLABaseBase.a = 0x20;
  local_250.super_QVLABaseBase.s = 0;
  uVar3 = puVar6[3];
  local_250.super_QVLABaseBase.ptr = local_238;
  if ((int)uVar3 < 1) goto LAB_00283b82;
  uVar14 = uVar3 + 1;
  iVar13 = uVar3 * 2 + -1;
  qVar17 = value;
  do {
    puVar6 = (this->data).d;
    uVar3 = puVar6[4];
    puVar7 = (this->mobj->d).data;
    uVar4 = puVar7[iVar13 + uVar3];
    if ((uVar2 & 0x40) == 0) {
      uVar16 = (long)(int)uVar4;
      if (bVar10) {
        uVar16 = (ulong)uVar4;
      }
    }
    else {
      uVar16 = CONCAT44(puVar7[(uVar3 + puVar6[3] * 2 + uVar14) - 2],uVar4);
    }
    if ((uVar16 == value) || (uVar16 != 0 && (uVar16 & ~qVar17) == 0)) {
      puVar6 = (this->mobj->d).stringdata;
      local_260.m_size = (qsizetype)puVar6[(int)(puVar7[(uVar3 + iVar13) - 1] * 2 + 1)];
      local_260.m_data =
           (storage_type *)
           ((ulong)puVar6[(long)(int)puVar7[(uVar3 + iVar13) - 1] * 2] + (long)puVar6);
      QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                (&local_250,0x20,local_238,&local_260);
      qVar17 = qVar17 & ~uVar16;
    }
    uVar14 = uVar14 - 1;
    iVar13 = iVar13 + -2;
  } while (1 < uVar14);
  if (local_250.super_QVLABaseBase.s != 0) {
    lVar15 = local_250.super_QVLABaseBase.s + -1;
    lVar12 = 0;
    do {
      lVar15 = lVar15 + *(long *)((long)local_250.super_QVLABaseBase.ptr + lVar12);
      lVar12 = lVar12 + 0x10;
    } while (local_250.super_QVLABaseBase.s << 4 != lVar12);
    pDVar11 = (__return_storage_ptr__->d).d;
    if (((pDVar11 == (Data *)0x0) ||
        (1 < (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       (lVar12 = (pDVar11->super_QArrayData).alloc,
       (long)((((ulong)((long)&pDVar11[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
              lVar12) - (long)(__return_storage_ptr__->d).ptr) < lVar15)) {
      lVar12 = (__return_storage_ptr__->d).size;
      if (lVar15 < lVar12) {
        lVar15 = lVar12;
      }
      QByteArray::reallocData(__return_storage_ptr__,lVar15,KeepSize);
      pDVar11 = (__return_storage_ptr__->d).d;
      if (pDVar11 != (Data *)0x0) {
        lVar12 = (pDVar11->super_QArrayData).alloc;
        goto LAB_00283b19;
      }
    }
    else {
LAB_00283b19:
      if (lVar12 != 0) {
        pAVar1 = &(pDVar11->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    pvVar9 = local_250.super_QVLABaseBase.ptr;
    if (local_250.super_QVLABaseBase.s != 0) {
      lVar15 = local_250.super_QVLABaseBase.s << 4;
      bVar10 = true;
      do {
        if (!bVar10) {
          QByteArray::append(__return_storage_ptr__,'|');
        }
        QByteArray::append(__return_storage_ptr__,*(char **)((long)pvVar9 + lVar15 + -8),
                           *(qsizetype *)((long)pvVar9 + lVar15 + -0x10));
        bVar10 = false;
        lVar15 = lVar15 + -0x10;
      } while (lVar15 != 0);
    }
  }
  if ((undefined1 *)local_250.super_QVLABaseBase.ptr != local_238) {
    QtPrivate::sizedFree(local_250.super_QVLABaseBase.ptr,local_250.super_QVLABaseBase.a << 4);
  }
LAB_00283b82:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaEnum::valueToKeys(quint64 value) const
{
    QByteArray keys;
    if (!mobj)
        return keys;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return keys;

    QVarLengthArray<QByteArrayView, sizeof(int) * CHAR_BIT> parts;
    quint64 v = value;

    // reverse iterate to ensure values like Qt::Dialog=0x2|Qt::Window are processed first.
    for (int i = data.keyCount() - 1; i >= 0; --i) {
        quint64 k = value_helper(i, mode);
        if ((k != 0 && (v & k) == k) || (k == value)) {
            v = v & ~k;
            parts.push_back(stringDataView(mobj, mobj->d.data[data.data() + 2 * i]));
        }
    }
    join_reversed(keys, parts, '|');
    return keys;
}